

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::setStarter
          (SPxSolverBase<double> *this,SPxStarter<double> *x,bool destroy)

{
  SPxStarter<double> *pSVar1;
  shared_ptr<soplex::Tolerances> *psVar2;
  byte in_DL;
  SPxStarter<double> *in_RSI;
  SPxSolverBase<double> *in_RDI;
  
  if ((in_RDI->freeStarter & 1U) != 0) {
    if (in_RDI->thestarter != (SPxStarter<double> *)0x0) {
      (*in_RDI->thestarter->_vptr_SPxStarter[1])();
    }
    in_RDI->thestarter = (SPxStarter<double> *)0x0;
  }
  in_RDI->thestarter = in_RSI;
  if (in_RDI->thestarter != (SPxStarter<double> *)0x0) {
    pSVar1 = in_RDI->thestarter;
    psVar2 = tolerances(in_RDI);
    (*pSVar1->_vptr_SPxStarter[5])(pSVar1,psVar2);
  }
  in_RDI->freeStarter = (bool)(in_DL & 1);
  return;
}

Assistant:

void SPxSolverBase<R>::setStarter(SPxStarter<R>* x, const bool destroy)
{

   assert(!freeStarter || thestarter != nullptr);

   if(freeStarter)
   {
      delete thestarter;
      thestarter = nullptr;
   }

   thestarter = x;

   if(thestarter != nullptr)
      thestarter->setTolerances(this->tolerances());

   freeStarter = destroy;
}